

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  add_thousands_sep<char> sep;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  uint uStack_c;
  
  sep.sep_.size_ = 1;
  sep.sep_.data_ = (char *)(this + 0xc);
  sep._16_8_ = (ulong)uStack_c << 0x20;
  bVar1 = internal::
          format_decimal<char,unsigned_long,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,fmt::v5::internal::add_thousands_sep<char>>
                    ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)
                     it->container,*(unsigned_long *)this,*(int *)(this + 8),sep);
  it->container = (list<char,_std::allocator<char>_> *)bVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }